

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_endpointer.c
# Opt level: O2

int16 * ps_endpointer_process(ps_endpointer_t *ep,int16 *frame)

{
  uint uVar1;
  int iVar2;
  ps_vad_class_t pVar3;
  int iVar4;
  ulong uVar5;
  int16 *piVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  ps_vad_t *vad;
  long lVar10;
  double dVar11;
  
  if ((ep != (ps_endpointer_t *)0x0) && (vad = ep->vad, vad != (ps_vad_t *)0x0)) {
    if ((ep->in_speech != 0) && (ep->n == ep->maxlen)) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_endpointer.c"
              ,0x126,"VAD queue overflow (should not happen)");
      vad = ep->vad;
    }
    pVar3 = ps_vad_classify(vad,frame);
    lVar10 = (long)((ep->n + ep->pos) % ep->maxlen);
    memcpy(ep->buf + ep->frame_size * lVar10,frame,(long)ep->frame_size * 2);
    ep->is_speech[lVar10] = (int8)pVar3;
    uVar1 = ep->maxlen;
    uVar8 = ep->n;
    if (uVar8 == uVar1) {
      dVar11 = ep->frame_length;
      ep->qstart_time = ep->qstart_time + dVar11;
      ep->pos = (ep->pos + 1) % (int)uVar8;
    }
    else {
      uVar8 = uVar8 + 1;
      ep->n = uVar8;
      dVar11 = ep->frame_length;
    }
    ep->timestamp = dVar11 + ep->timestamp;
    if (uVar8 == 0) {
      iVar9 = 0;
    }
    else if (uVar8 == uVar1) {
      uVar5 = 0;
      uVar7 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar7 = uVar5;
      }
      iVar9 = 0;
      for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
        iVar9 = iVar9 + ep->is_speech[uVar5];
      }
    }
    else {
      iVar2 = ep->pos;
      iVar9 = (int)ep->is_speech[iVar2];
      uVar7 = (ulong)(iVar2 + 1);
      while (iVar4 = (int)uVar7, iVar4 != (int)(uVar8 + iVar2) % (int)uVar1) {
        iVar9 = iVar9 + ep->is_speech[iVar4];
        uVar7 = (long)(iVar4 + 1) % (long)(int)uVar1 & 0xffffffff;
      }
    }
    if (ep->in_speech == 0) {
      if (iVar9 <= ep->start_frames) {
        return (int16 *)0x0;
      }
      ep->speech_start = ep->qstart_time;
      ep->speech_end = 0.0;
      ep->in_speech = 1;
    }
    else if (iVar9 < ep->end_frames) {
      piVar6 = ep_pop(ep,(int *)0x0);
      ep->speech_end = ep->qstart_time;
      ep->in_speech = 0;
      return piVar6;
    }
    piVar6 = ep_pop(ep,(int *)0x0);
    return piVar6;
  }
  return (int16 *)0x0;
}

Assistant:

const int16 *
ps_endpointer_process(ps_endpointer_t *ep,
                      const int16 *frame)
{
    int is_speech, speech_count;
    if (ep == NULL || ep->vad == NULL)
        return NULL;
    if (ep->in_speech && ep_full(ep)) {
        E_ERROR("VAD queue overflow (should not happen)");
        /* Not fatal, we just lose data. */
    }
    is_speech = ps_vad_classify(ep->vad, frame);
    ep_push(ep, is_speech, frame);
    ep->timestamp += ep->frame_length;
    speech_count = ep_speech_count(ep);
    E_DEBUG("%.2f %d %d %d\n", ep->timestamp, speech_count,
            ep->start_frames, ep->end_frames);
    if (ep->in_speech) {
        if (speech_count < ep->end_frames) {
            /* Return only the first frame.  Either way it's sort of
               arbitrary, but this avoids having to drain the queue to
               prevent overlapping segments.  It's also closer to what
               human annotators will do. */
            int16 *pcm = ep_pop(ep, NULL);
            ep->speech_end = ep->qstart_time;
            ep->in_speech = FALSE;
            return pcm;
        }
    }
    else {
        if (speech_count > ep->start_frames) {
            ep->speech_start = ep->qstart_time;
            ep->speech_end = 0;
            ep->in_speech = TRUE;
        }
    }
    if (ep->in_speech)
        return ep_pop(ep, NULL);
    else
        return NULL;
}